

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O3

void __thiscall
sisl::
array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::~array_n(array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *this)

{
  iterator i;
  pointer pMVar1;
  
  if (this->_array != (Matrix<double,__1,_1,_0,__1,_1> *)0x0) {
    pMVar1 = this->first;
    if ((pMVar1 != this->last) && (this->_dims[1] * this->_dims[0] != 0)) {
      if (pMVar1 < this->last) {
        do {
          free((pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data);
          pMVar1 = pMVar1 + 1;
        } while (pMVar1 < this->last);
        pMVar1 = this->first;
      }
      operator_delete(pMVar1);
    }
  }
  this->_array = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  return;
}

Assistant:

~array_n() {
            unsigned int size = 1;
            for(int i = 0; i < N; i++) {
                size *= _dims[i];
            }

            // Check if the array has been allocated in the first place
            if (this->_array != nullptr && first != last && size != 0) {
                for (iterator i = first; i < last; ++i) {
                    Allocator::destroy(i);
                }
                Allocator::deallocate(first, last - first);
            }
            this->_array = nullptr;
        }